

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int client_hello_decode_server_name(char **name,uint8_t *src,uint8_t *end)

{
  uint8_t *__s;
  int iVar1;
  void *pvVar2;
  char *__dest;
  ulong uVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  
  if ((ulong)((long)end - (long)src) < 2) {
    return 0x32;
  }
  uVar3 = (ulong)(ushort)(*(ushort *)src << 8 | *(ushort *)src >> 8);
  puVar5 = src + 2;
  if (((ulong)((long)end - (long)puVar5) < uVar3) || (uVar3 == 0)) {
LAB_0010b5d6:
    iVar1 = 0x32;
  }
  else {
    puVar4 = src + uVar3 + 2;
    do {
      if (puVar4 + ~(ulong)puVar5 < (uint8_t *)0x2) goto LAB_0010b5d6;
      uVar3 = (ulong)(ushort)(*(ushort *)(puVar5 + 1) << 8 | *(ushort *)(puVar5 + 1) >> 8);
      __s = puVar5 + 3;
      if ((ulong)((long)puVar4 - (long)__s) < uVar3) goto LAB_0010b5d6;
      if (*puVar5 == '\0') {
        pvVar2 = memchr(__s,0,uVar3);
        if (pvVar2 != (void *)0x0) {
          return 0x2f;
        }
        if (*name != (char *)0x0) {
          return 0x2f;
        }
        __dest = (char *)malloc(uVar3 + 1);
        *name = __dest;
        if (__dest == (char *)0x0) {
          return 0x201;
        }
        memcpy(__dest,__s,uVar3);
        __dest[uVar3] = '\0';
      }
      puVar5 = __s + uVar3;
    } while (puVar5 != puVar4);
    iVar1 = 0x32;
    if (puVar4 == end) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int client_hello_decode_server_name(char **name, const uint8_t *src, const uint8_t *end)
{
    int ret = 0;

    decode_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        do {
            uint8_t type = *src++;
            decode_open_block(src, end, 2, {
                if (type == 0) {
                    if (memchr(src, '\0', end - src) != 0) {
                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                        goto Exit;
                    }
                    if (*name != NULL) {
                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                        goto Exit;
                    }
                    if ((*name = malloc(end - src + 1)) == NULL) {
                        ret = PTLS_ERROR_NO_MEMORY;
                        goto Exit;
                    }
                    memcpy(*name, src, end - src);
                    (*name)[end - src] = '\0';
                }
                src = end;
            });
        } while (src != end);
    });

Exit:
    return ret;
}